

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall btMultiBody::finalizeMultiDof(btMultiBody *this)

{
  btVector3 *in_RDI;
  btScalar in_stack_ffffffffffffffdc;
  btMultiBody *in_stack_ffffffffffffffe0;
  
  btAlignedObjectArray<float>::resize
            ((btAlignedObjectArray<float> *)in_stack_ffffffffffffffe0,(int)in_stack_ffffffffffffffdc
             ,in_RDI->m_floats);
  btAlignedObjectArray<float>::resize
            ((btAlignedObjectArray<float> *)in_stack_ffffffffffffffe0,(int)in_stack_ffffffffffffffdc
             ,in_RDI->m_floats);
  btAlignedObjectArray<float>::resize
            ((btAlignedObjectArray<float> *)in_stack_ffffffffffffffe0,(int)in_stack_ffffffffffffffdc
             ,in_RDI->m_floats);
  btVector3::btVector3((btVector3 *)&stack0xffffffffffffffdc);
  btAlignedObjectArray<btVector3>::resize
            ((btAlignedObjectArray<btVector3> *)in_stack_ffffffffffffffe0,
             (int)in_stack_ffffffffffffffdc,in_RDI);
  updateLinksDofOffsets(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void btMultiBody::finalizeMultiDof()
{
	m_deltaV.resize(0);
	m_deltaV.resize(6 + m_dofCount);
	m_realBuf.resize(6 + m_dofCount + m_dofCount*m_dofCount + 6 + m_dofCount);			//m_dofCount for joint-space vels + m_dofCount^2 for "D" matrices + delta-pos vector (6 base "vels" + joint "vels")
	m_vectorBuf.resize(2 * m_dofCount);													//two 3-vectors (i.e. one six-vector) for each system dof	("h" matrices)

	updateLinksDofOffsets();
}